

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>
 __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder<testing::internal::ParamGenerator<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>_>,_testing::internal::ParamGenerator<unsigned_char>_>
           *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CartesianProductGenerator<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>
  *in_RSI;
  tuple<testing::internal::ParamGenerator<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>_>,_testing::internal::ParamGenerator<unsigned_char>_>
  *in_RDI;
  ParamGenerator<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>
  PVar1;
  ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>
  *in_stack_ffffffffffffffb8;
  tuple<testing::internal::ParamGenerator<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>_>,_testing::internal::ParamGenerator<unsigned_char>_>
  *g;
  
  g = in_RDI;
  operator_new(0x28);
  CartesianProductGenerator<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>
  ::CartesianProductGenerator(in_RSI,g);
  ParamGenerator<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>
  ::ParamGenerator((ParamGenerator<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>
                    *)in_RDI,in_stack_ffffffffffffffb8);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)g;
  return (ParamGenerator<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }